

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double uniform_pdf(double x,double a,double b)

{
  return (double)(~-(ulong)(x < a) & ~-(ulong)(b < x) & (ulong)(1.0 / (b - a)));
}

Assistant:

double uniform_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    UNIFORM_PDF evaluates the Uniform PDF.
//
//  Discussion:
//
//    The Uniform PDF is also known as the "Rectangular" or "de Moivre" PDF.
//
//    PDF(A,B;X) = 1 / ( B - A ) for A <= X <= B
//               = 0 otherwise
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameters of the PDF.
//    A < B.
//
//    Output, double UNIFORM_PDF, the value of the PDF.
//
{
  double pdf;

  if ( x < a || b < x )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = 1.0 / ( b - a );
  }

  return pdf;
}